

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void P_SerializeWorldActors(FArchive *arc)

{
  bool bVar1;
  FArchive *pFVar2;
  bool bVar3;
  int iVar4;
  TObjPtr<AActor> *pTVar5;
  long lVar6;
  line_t *plVar7;
  
  if (0 < numsectors) {
    pTVar5 = &sectors->SoundTarget;
    iVar4 = 0;
    do {
      pFVar2 = FArchive::SerializeObject(arc,(DObject **)pTVar5,AActor::RegistrationInfo.MyClass);
      pFVar2 = FArchive::SerializeObject
                         (pFVar2,(DObject **)(pTVar5 + 0x1c),ASectorAction::RegistrationInfo.MyClass
                         );
      pFVar2 = FArchive::SerializeObject
                         (pFVar2,(DObject **)(pTVar5 + 10),DSectorEffect::RegistrationInfo.MyClass);
      pFVar2 = FArchive::SerializeObject
                         (pFVar2,(DObject **)(pTVar5 + 0xb),DSectorEffect::RegistrationInfo.MyClass)
      ;
      FArchive::SerializeObject
                (pFVar2,(DObject **)(pTVar5 + 0xc),DSectorEffect::RegistrationInfo.MyClass);
      iVar4 = iVar4 + 1;
      pTVar5 = pTVar5 + 0x4d;
    } while (iVar4 < numsectors);
  }
  if ((ulong)sectorPortals.Count != 0) {
    pTVar5 = &(sectorPortals.Array)->mSkybox;
    lVar6 = (ulong)sectorPortals.Count << 6;
    do {
      FArchive::SerializeObject(arc,(DObject **)pTVar5,AActor::RegistrationInfo.MyClass);
      pTVar5 = pTVar5 + 8;
      lVar6 = lVar6 + -0x40;
    } while (lVar6 != 0);
  }
  if (0 < numlines) {
    iVar4 = 0;
    plVar7 = lines;
    do {
      lVar6 = 0;
      bVar1 = true;
      do {
        bVar3 = bVar1;
        if (plVar7->sidedef[lVar6] != (side_t *)0x0) {
          DBaseDecal::SerializeChain(arc,&plVar7->sidedef[lVar6]->AttachedDecals);
        }
        lVar6 = 1;
        bVar1 = false;
      } while (bVar3);
      iVar4 = iVar4 + 1;
      plVar7 = plVar7 + 1;
    } while (iVar4 < numlines);
  }
  return;
}

Assistant:

void P_SerializeWorldActors(FArchive &arc)
{
	int i;
	sector_t *sec;
	line_t *line;

	for (i = 0, sec = sectors; i < numsectors; i++, sec++)
	{
		arc << sec->SoundTarget
			<< sec->SecActTarget
			<< sec->floordata
			<< sec->ceilingdata
			<< sec->lightingdata;
	}
	for (auto &s : sectorPortals)
	{
		arc << s.mSkybox;
	}
	for (i = 0, line = lines; i < numlines; i++, line++)
	{
		for (int s = 0; s < 2; s++)
		{
			if (line->sidedef[s] != NULL)
			{
				DBaseDecal::SerializeChain(arc, &line->sidedef[s]->AttachedDecals);
			}
		}
	}
}